

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QCache<QString,_QHostInfoCache::QHostInfoCacheElement>::Node>::addStorage
          (Span<QCache<QString,_QHostInfoCache::QHostInfoCacheElement>::Node> *this)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  byte bVar4;
  undefined8 uVar5;
  QHostInfo *this_00;
  int *piVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Entry *pEVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  size_t i;
  ulong uVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar44;
  undefined1 auVar42 [16];
  int iVar45;
  undefined1 auVar43 [16];
  int iVar46;
  int iVar57;
  int iVar58;
  int iVar59;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar70;
  undefined1 auVar69 [16];
  int iVar71;
  long lVar72;
  long lVar80;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  long lVar81;
  long lVar82;
  Entry *local_60;
  long local_58;
  
  bVar4 = this->allocated;
  if (bVar4 == 0x30) {
    local_58 = 0x50;
    uVar18 = 0x1180;
LAB_001b336f:
    local_60 = (Entry *)operator_new__(uVar18);
    lVar16 = 0;
    uVar18 = 0;
    do {
      puVar1 = (local_60->storage).data + lVar16;
      pEVar15 = this->entries;
      puVar2 = (pEVar15->storage).data + lVar16;
      uVar5 = *(undefined8 *)(puVar2 + 8);
      puVar3 = (local_60->storage).data + lVar16;
      *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
      *(undefined8 *)(puVar3 + 8) = uVar5;
      uVar5 = *(undefined8 *)((pEVar15->storage).data + lVar16 + 0x10);
      puVar2 = (pEVar15->storage).data + lVar16 + 0x10;
      puVar2[0] = '\0';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      puVar2[4] = '\0';
      puVar2[5] = '\0';
      puVar2[6] = '\0';
      puVar2[7] = '\0';
      *(undefined8 *)((local_60->storage).data + lVar16 + 0x10) = uVar5;
      uVar5 = *(undefined8 *)((pEVar15->storage).data + lVar16 + 0x18);
      puVar2 = (pEVar15->storage).data + lVar16 + 0x18;
      puVar2[0] = '\0';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      puVar2[4] = '\0';
      puVar2[5] = '\0';
      puVar2[6] = '\0';
      puVar2[7] = '\0';
      *(undefined8 *)((local_60->storage).data + lVar16 + 0x18) = uVar5;
      uVar5 = *(undefined8 *)((pEVar15->storage).data + lVar16 + 0x20);
      puVar2 = (pEVar15->storage).data + lVar16 + 0x20;
      puVar2[0] = '\0';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      puVar2[4] = '\0';
      puVar2[5] = '\0';
      puVar2[6] = '\0';
      puVar2[7] = '\0';
      *(undefined8 *)((local_60->storage).data + lVar16 + 0x20) = uVar5;
      *(undefined8 *)((local_60->storage).data + lVar16 + 0x28) =
           *(undefined8 *)((pEVar15->storage).data + lVar16 + 0x28);
      *(undefined8 *)((local_60->storage).data + lVar16 + 0x30) =
           *(undefined8 *)((pEVar15->storage).data + lVar16 + 0x30);
      puVar2 = (pEVar15->storage).data + lVar16 + 0x28;
      puVar2[0] = '\0';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      puVar2[4] = '\0';
      puVar2[5] = '\0';
      puVar2[6] = '\0';
      puVar2[7] = '\0';
      *(uchar **)(*(long *)((local_60->storage).data + lVar16) + 8) = puVar1;
      **(long **)((local_60->storage).data + lVar16 + 8) = (long)puVar1;
      pEVar15 = this->entries;
      this_00 = *(QHostInfo **)((pEVar15->storage).data + lVar16 + 0x28);
      if (this_00 != (QHostInfo *)0x0) {
        QHostInfo::~QHostInfo(this_00);
      }
      operator_delete(this_00,0x18);
      piVar6 = *(int **)((pEVar15->storage).data + lVar16 + 0x10);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          QArrayData::deallocate(*(QArrayData **)((pEVar15->storage).data + lVar16 + 0x10),2,0x10);
        }
      }
      uVar18 = uVar18 + 1;
      uVar19 = (ulong)this->allocated;
      lVar16 = lVar16 + 0x38;
    } while (uVar18 < uVar19);
    if ((uint)local_58 <= (uint)this->allocated) goto LAB_001b3b12;
  }
  else {
    if (bVar4 != 0) {
      local_58 = (ulong)bVar4 + 0x10;
      uVar18 = local_58 * 0x38;
      goto LAB_001b336f;
    }
    local_60 = (Entry *)operator_new__(0xa80);
    local_58 = 0x30;
    uVar19 = 0;
  }
  lVar16 = local_58 - uVar19;
  lVar17 = lVar16 + -1;
  lVar72 = uVar19 + 0xe;
  lVar80 = uVar19 + 0xf;
  lVar30 = uVar19 + 0xc;
  lVar31 = uVar19 + 0xd;
  lVar32 = uVar19 + 10;
  lVar33 = uVar19 + 0xb;
  lVar34 = uVar19 + 8;
  lVar35 = uVar19 + 9;
  lVar36 = uVar19 + 6;
  lVar37 = uVar19 + 7;
  lVar38 = uVar19 + 4;
  lVar39 = uVar19 + 5;
  lVar81 = uVar19 + 2;
  lVar82 = uVar19 + 3;
  lVar20 = uVar19 + 1;
  auVar21._8_4_ = (int)lVar17;
  auVar21._0_8_ = lVar17;
  auVar21._12_4_ = (int)((ulong)lVar17 >> 0x20);
  pEVar15 = local_60 + uVar19;
  uVar18 = 0;
  do {
    auVar69._8_4_ = (int)uVar18;
    auVar69._0_8_ = uVar18;
    auVar69._12_4_ = (int)(uVar18 >> 0x20);
    auVar42 = auVar21 ^ _DAT_00258740;
    auVar40 = (auVar69 | _DAT_00258730) ^ _DAT_00258740;
    iVar70 = auVar42._0_4_;
    iVar46 = -(uint)(iVar70 < auVar40._0_4_);
    iVar71 = auVar42._4_4_;
    iVar57 = -(uint)(iVar71 < auVar40._4_4_);
    iVar44 = auVar42._8_4_;
    iVar58 = -(uint)(iVar44 < auVar40._8_4_);
    iVar45 = auVar42._12_4_;
    iVar59 = -(uint)(iVar45 < auVar40._12_4_);
    auVar73._4_4_ = iVar46;
    auVar73._0_4_ = iVar46;
    auVar73._8_4_ = iVar58;
    auVar73._12_4_ = iVar58;
    auVar65 = pshuflw(in_XMM12,auVar73,0xe8);
    auVar47._4_4_ = -(uint)(auVar40._4_4_ == iVar71);
    auVar47._12_4_ = -(uint)(auVar40._12_4_ == iVar45);
    auVar47._0_4_ = auVar47._4_4_;
    auVar47._8_4_ = auVar47._12_4_;
    auVar60 = pshuflw(in_XMM10,auVar47,0xe8);
    auVar41._4_4_ = iVar57;
    auVar41._0_4_ = iVar57;
    auVar41._8_4_ = iVar59;
    auVar41._12_4_ = iVar59;
    auVar42 = pshuflw(_DAT_00258740,auVar41,0xe8);
    auVar40._8_4_ = 0xffffffff;
    auVar40._0_8_ = 0xffffffffffffffff;
    auVar40._12_4_ = 0xffffffff;
    auVar40 = (auVar42 | auVar60 & auVar65) ^ auVar40;
    auVar40 = packssdw(auVar40,auVar40);
    if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      (pEVar15->storage).data[0] = (char)uVar19 + '\x01';
    }
    auVar41 = auVar47 & auVar73 | auVar41;
    auVar40 = packssdw(auVar41,auVar41);
    auVar42._8_4_ = 0xffffffff;
    auVar42._0_8_ = 0xffffffffffffffff;
    auVar42._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 ^ auVar42,auVar40 ^ auVar42);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._0_4_ >> 8 & 1) != 0) {
      pEVar15[1].storage.data[0] = (char)lVar20 + '\x01';
    }
    auVar40 = (auVar69 | _DAT_00258720) ^ _DAT_00258740;
    iVar46 = -(uint)(iVar70 < auVar40._0_4_);
    iVar58 = -(uint)(iVar71 < auVar40._4_4_);
    iVar57 = -(uint)(iVar44 < auVar40._8_4_);
    iVar59 = -(uint)(iVar45 < auVar40._12_4_);
    auVar65._4_4_ = iVar46;
    auVar65._0_4_ = iVar46;
    auVar65._8_4_ = iVar57;
    auVar65._12_4_ = iVar57;
    iVar46 = -(uint)(auVar40._4_4_ == iVar71);
    iVar57 = -(uint)(auVar40._12_4_ == iVar45);
    auVar74._4_4_ = iVar46;
    auVar74._0_4_ = iVar46;
    auVar74._8_4_ = iVar57;
    auVar74._12_4_ = iVar57;
    auVar66._4_4_ = iVar58;
    auVar66._0_4_ = iVar58;
    auVar66._8_4_ = iVar59;
    auVar66._12_4_ = iVar59;
    auVar40 = auVar74 & auVar65 | auVar66;
    auVar40 = packssdw(auVar40,auVar40);
    auVar60._8_4_ = 0xffffffff;
    auVar60._0_8_ = 0xffffffffffffffff;
    auVar60._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 ^ auVar60,auVar40 ^ auVar60);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._0_4_ >> 0x10 & 1) != 0) {
      pEVar15[2].storage.data[0] = (char)lVar81 + '\x01';
    }
    auVar40 = pshufhw(auVar40,auVar65,0x84);
    auVar47 = pshufhw(auVar65,auVar74,0x84);
    auVar42 = pshufhw(auVar40,auVar66,0x84);
    auVar22._8_4_ = 0xffffffff;
    auVar22._0_8_ = 0xffffffffffffffff;
    auVar22._12_4_ = 0xffffffff;
    auVar22 = (auVar42 | auVar47 & auVar40) ^ auVar22;
    auVar40 = packssdw(auVar22,auVar22);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._0_4_ >> 0x18 & 1) != 0) {
      pEVar15[3].storage.data[0] = (char)lVar82 + '\x01';
    }
    auVar40 = (auVar69 | _DAT_00258710) ^ _DAT_00258740;
    auVar61._0_4_ = -(uint)(iVar70 < auVar40._0_4_);
    auVar61._4_4_ = -(uint)(iVar71 < auVar40._4_4_);
    auVar61._8_4_ = -(uint)(iVar44 < auVar40._8_4_);
    auVar61._12_4_ = -(uint)(iVar45 < auVar40._12_4_);
    auVar75._4_4_ = auVar61._0_4_;
    auVar75._0_4_ = auVar61._0_4_;
    auVar75._8_4_ = auVar61._8_4_;
    auVar75._12_4_ = auVar61._8_4_;
    auVar47 = pshuflw(auVar66,auVar75,0xe8);
    auVar23._0_4_ = -(uint)(auVar40._0_4_ == iVar70);
    auVar23._4_4_ = -(uint)(auVar40._4_4_ == iVar71);
    auVar23._8_4_ = -(uint)(auVar40._8_4_ == iVar44);
    auVar23._12_4_ = -(uint)(auVar40._12_4_ == iVar45);
    auVar48._4_4_ = auVar23._4_4_;
    auVar48._0_4_ = auVar23._4_4_;
    auVar48._8_4_ = auVar23._12_4_;
    auVar48._12_4_ = auVar23._12_4_;
    auVar40 = pshuflw(auVar23,auVar48,0xe8);
    auVar49._4_4_ = auVar61._4_4_;
    auVar49._0_4_ = auVar61._4_4_;
    auVar49._8_4_ = auVar61._12_4_;
    auVar49._12_4_ = auVar61._12_4_;
    auVar42 = pshuflw(auVar61,auVar49,0xe8);
    auVar7._8_4_ = 0xffffffff;
    auVar7._0_8_ = 0xffffffffffffffff;
    auVar7._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 & auVar47,(auVar42 | auVar40 & auVar47) ^ auVar7);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      pEVar15[4].storage.data[0] = (char)lVar38 + '\x01';
    }
    auVar49 = auVar48 & auVar75 | auVar49;
    auVar42 = packssdw(auVar49,auVar49);
    auVar8._8_4_ = 0xffffffff;
    auVar8._0_8_ = 0xffffffffffffffff;
    auVar8._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40,auVar42 ^ auVar8);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._4_2_ >> 8 & 1) != 0) {
      pEVar15[5].storage.data[0] = (char)lVar39 + '\x01';
    }
    auVar40 = (auVar69 | _DAT_00258700) ^ _DAT_00258740;
    iVar46 = -(uint)(iVar70 < auVar40._0_4_);
    iVar58 = -(uint)(iVar71 < auVar40._4_4_);
    iVar57 = -(uint)(iVar44 < auVar40._8_4_);
    iVar59 = -(uint)(iVar45 < auVar40._12_4_);
    auVar50._4_4_ = iVar46;
    auVar50._0_4_ = iVar46;
    auVar50._8_4_ = iVar57;
    auVar50._12_4_ = iVar57;
    iVar46 = -(uint)(auVar40._4_4_ == iVar71);
    iVar57 = -(uint)(auVar40._12_4_ == iVar45);
    auVar67._4_4_ = iVar46;
    auVar67._0_4_ = iVar46;
    auVar67._8_4_ = iVar57;
    auVar67._12_4_ = iVar57;
    auVar76._4_4_ = iVar58;
    auVar76._0_4_ = iVar58;
    auVar76._8_4_ = iVar59;
    auVar76._12_4_ = iVar59;
    auVar40 = auVar67 & auVar50 | auVar76;
    auVar40 = packssdw(auVar40,auVar40);
    auVar9._8_4_ = 0xffffffff;
    auVar9._0_8_ = 0xffffffffffffffff;
    auVar9._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 ^ auVar9,auVar40 ^ auVar9);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      pEVar15[6].storage.data[0] = (char)lVar36 + '\x01';
    }
    auVar40 = pshufhw(auVar40,auVar50,0x84);
    auVar47 = pshufhw(auVar50,auVar67,0x84);
    auVar42 = pshufhw(auVar40,auVar76,0x84);
    auVar24._8_4_ = 0xffffffff;
    auVar24._0_8_ = 0xffffffffffffffff;
    auVar24._12_4_ = 0xffffffff;
    auVar24 = (auVar42 | auVar47 & auVar40) ^ auVar24;
    auVar40 = packssdw(auVar24,auVar24);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._6_2_ >> 8 & 1) != 0) {
      pEVar15[7].storage.data[0] = (char)lVar37 + '\x01';
    }
    auVar40 = (auVar69 | _DAT_002586f0) ^ _DAT_00258740;
    auVar62._0_4_ = -(uint)(iVar70 < auVar40._0_4_);
    auVar62._4_4_ = -(uint)(iVar71 < auVar40._4_4_);
    auVar62._8_4_ = -(uint)(iVar44 < auVar40._8_4_);
    auVar62._12_4_ = -(uint)(iVar45 < auVar40._12_4_);
    auVar77._4_4_ = auVar62._0_4_;
    auVar77._0_4_ = auVar62._0_4_;
    auVar77._8_4_ = auVar62._8_4_;
    auVar77._12_4_ = auVar62._8_4_;
    auVar47 = pshuflw(auVar67,auVar77,0xe8);
    auVar25._0_4_ = -(uint)(auVar40._0_4_ == iVar70);
    auVar25._4_4_ = -(uint)(auVar40._4_4_ == iVar71);
    auVar25._8_4_ = -(uint)(auVar40._8_4_ == iVar44);
    auVar25._12_4_ = -(uint)(auVar40._12_4_ == iVar45);
    auVar51._4_4_ = auVar25._4_4_;
    auVar51._0_4_ = auVar25._4_4_;
    auVar51._8_4_ = auVar25._12_4_;
    auVar51._12_4_ = auVar25._12_4_;
    auVar40 = pshuflw(auVar25,auVar51,0xe8);
    auVar52._4_4_ = auVar62._4_4_;
    auVar52._0_4_ = auVar62._4_4_;
    auVar52._8_4_ = auVar62._12_4_;
    auVar52._12_4_ = auVar62._12_4_;
    auVar42 = pshuflw(auVar62,auVar52,0xe8);
    auVar63._8_4_ = 0xffffffff;
    auVar63._0_8_ = 0xffffffffffffffff;
    auVar63._12_4_ = 0xffffffff;
    auVar63 = (auVar42 | auVar40 & auVar47) ^ auVar63;
    auVar42 = packssdw(auVar63,auVar63);
    auVar40 = packsswb(auVar40 & auVar47,auVar42);
    if ((auVar40 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pEVar15[8].storage.data[0] = (char)lVar34 + '\x01';
    }
    auVar52 = auVar51 & auVar77 | auVar52;
    auVar42 = packssdw(auVar52,auVar52);
    auVar10._8_4_ = 0xffffffff;
    auVar10._0_8_ = 0xffffffffffffffff;
    auVar10._12_4_ = 0xffffffff;
    auVar42 = packssdw(auVar42 ^ auVar10,auVar42 ^ auVar10);
    auVar40 = packsswb(auVar40,auVar42);
    if ((auVar40._8_2_ >> 8 & 1) != 0) {
      pEVar15[9].storage.data[0] = (char)lVar35 + '\x01';
    }
    auVar40 = (auVar69 | _DAT_002586e0) ^ _DAT_00258740;
    iVar46 = -(uint)(iVar70 < auVar40._0_4_);
    iVar58 = -(uint)(iVar71 < auVar40._4_4_);
    iVar57 = -(uint)(iVar44 < auVar40._8_4_);
    iVar59 = -(uint)(iVar45 < auVar40._12_4_);
    auVar53._4_4_ = iVar46;
    auVar53._0_4_ = iVar46;
    auVar53._8_4_ = iVar57;
    auVar53._12_4_ = iVar57;
    iVar46 = -(uint)(auVar40._4_4_ == iVar71);
    iVar57 = -(uint)(auVar40._12_4_ == iVar45);
    auVar68._4_4_ = iVar46;
    auVar68._0_4_ = iVar46;
    auVar68._8_4_ = iVar57;
    auVar68._12_4_ = iVar57;
    auVar78._4_4_ = iVar58;
    auVar78._0_4_ = iVar58;
    auVar78._8_4_ = iVar59;
    auVar78._12_4_ = iVar59;
    auVar40 = auVar68 & auVar53 | auVar78;
    auVar40 = packssdw(auVar40,auVar40);
    auVar11._8_4_ = 0xffffffff;
    auVar11._0_8_ = 0xffffffffffffffff;
    auVar11._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 ^ auVar11,auVar40 ^ auVar11);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      pEVar15[10].storage.data[0] = (char)lVar32 + '\x01';
    }
    auVar40 = pshufhw(auVar40,auVar53,0x84);
    auVar47 = pshufhw(auVar53,auVar68,0x84);
    auVar42 = pshufhw(auVar40,auVar78,0x84);
    auVar26._8_4_ = 0xffffffff;
    auVar26._0_8_ = 0xffffffffffffffff;
    auVar26._12_4_ = 0xffffffff;
    auVar26 = (auVar42 | auVar47 & auVar40) ^ auVar26;
    auVar40 = packssdw(auVar26,auVar26);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._10_2_ >> 8 & 1) != 0) {
      pEVar15[0xb].storage.data[0] = (char)lVar33 + '\x01';
    }
    auVar40 = (auVar69 | _DAT_002586d0) ^ _DAT_00258740;
    auVar64._0_4_ = -(uint)(iVar70 < auVar40._0_4_);
    auVar64._4_4_ = -(uint)(iVar71 < auVar40._4_4_);
    auVar64._8_4_ = -(uint)(iVar44 < auVar40._8_4_);
    auVar64._12_4_ = -(uint)(iVar45 < auVar40._12_4_);
    auVar79._4_4_ = auVar64._0_4_;
    auVar79._0_4_ = auVar64._0_4_;
    auVar79._8_4_ = auVar64._8_4_;
    auVar79._12_4_ = auVar64._8_4_;
    auVar47 = pshuflw(auVar68,auVar79,0xe8);
    auVar27._0_4_ = -(uint)(auVar40._0_4_ == iVar70);
    auVar27._4_4_ = -(uint)(auVar40._4_4_ == iVar71);
    auVar27._8_4_ = -(uint)(auVar40._8_4_ == iVar44);
    auVar27._12_4_ = -(uint)(auVar40._12_4_ == iVar45);
    auVar54._4_4_ = auVar27._4_4_;
    auVar54._0_4_ = auVar27._4_4_;
    auVar54._8_4_ = auVar27._12_4_;
    auVar54._12_4_ = auVar27._12_4_;
    auVar40 = pshuflw(auVar27,auVar54,0xe8);
    auVar55._4_4_ = auVar64._4_4_;
    auVar55._0_4_ = auVar64._4_4_;
    auVar55._8_4_ = auVar64._12_4_;
    auVar55._12_4_ = auVar64._12_4_;
    auVar42 = pshuflw(auVar64,auVar55,0xe8);
    auVar12._8_4_ = 0xffffffff;
    auVar12._0_8_ = 0xffffffffffffffff;
    auVar12._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 & auVar47,(auVar42 | auVar40 & auVar47) ^ auVar12);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      pEVar15[0xc].storage.data[0] = (char)lVar30 + '\x01';
    }
    auVar55 = auVar54 & auVar79 | auVar55;
    auVar42 = packssdw(auVar55,auVar55);
    auVar13._8_4_ = 0xffffffff;
    auVar13._0_8_ = 0xffffffffffffffff;
    auVar13._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40,auVar42 ^ auVar13);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._12_2_ >> 8 & 1) != 0) {
      pEVar15[0xd].storage.data[0] = (char)lVar31 + '\x01';
    }
    auVar40 = (auVar69 | _DAT_002586c0) ^ _DAT_00258740;
    auVar28._0_4_ = -(uint)(iVar70 < auVar40._0_4_);
    auVar28._4_4_ = -(uint)(iVar71 < auVar40._4_4_);
    auVar28._8_4_ = -(uint)(iVar44 < auVar40._8_4_);
    auVar28._12_4_ = -(uint)(iVar45 < auVar40._12_4_);
    auVar56._4_4_ = auVar28._0_4_;
    auVar56._0_4_ = auVar28._0_4_;
    auVar56._8_4_ = auVar28._8_4_;
    auVar56._12_4_ = auVar28._8_4_;
    iVar70 = -(uint)(auVar40._4_4_ == iVar71);
    iVar71 = -(uint)(auVar40._12_4_ == iVar45);
    auVar43._4_4_ = iVar70;
    auVar43._0_4_ = iVar70;
    auVar43._8_4_ = iVar71;
    auVar43._12_4_ = iVar71;
    in_XMM12._4_4_ = auVar28._4_4_;
    in_XMM12._0_4_ = auVar28._4_4_;
    in_XMM12._8_4_ = auVar28._12_4_;
    in_XMM12._12_4_ = auVar28._12_4_;
    in_XMM10 = auVar43 & auVar56 | in_XMM12;
    auVar40 = packssdw(auVar28,in_XMM10);
    auVar14._8_4_ = 0xffffffff;
    auVar14._0_8_ = 0xffffffffffffffff;
    auVar14._12_4_ = 0xffffffff;
    auVar40 = packssdw(auVar40 ^ auVar14,auVar40 ^ auVar14);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      pEVar15[0xe].storage.data[0] = (char)lVar72 + '\x01';
    }
    auVar40 = pshufhw(auVar40,auVar56,0x84);
    auVar47 = pshufhw(auVar43,auVar43,0x84);
    auVar42 = pshufhw(auVar40,in_XMM12,0x84);
    auVar29._8_4_ = 0xffffffff;
    auVar29._0_8_ = 0xffffffffffffffff;
    auVar29._12_4_ = 0xffffffff;
    auVar29 = (auVar42 | auVar47 & auVar40) ^ auVar29;
    auVar40 = packssdw(auVar29,auVar29);
    auVar40 = packsswb(auVar40,auVar40);
    if ((auVar40._14_2_ >> 8 & 1) != 0) {
      pEVar15[0xf].storage.data[0] = (char)lVar80 + '\x01';
    }
    uVar18 = uVar18 + 0x10;
    uVar19 = uVar19 + 0x10;
    lVar20 = lVar20 + 0x10;
    lVar81 = lVar81 + 0x10;
    lVar82 = lVar82 + 0x10;
    lVar38 = lVar38 + 0x10;
    lVar39 = lVar39 + 0x10;
    lVar36 = lVar36 + 0x10;
    lVar37 = lVar37 + 0x10;
    lVar34 = lVar34 + 0x10;
    lVar35 = lVar35 + 0x10;
    lVar32 = lVar32 + 0x10;
    lVar33 = lVar33 + 0x10;
    lVar30 = lVar30 + 0x10;
    lVar31 = lVar31 + 0x10;
    lVar72 = lVar72 + 0x10;
    lVar80 = lVar80 + 0x10;
    pEVar15 = pEVar15 + 0x10;
  } while ((lVar16 + 0xfU & 0xfffffffffffffff0) != uVar18);
LAB_001b3b12:
  if (this->entries != (Entry *)0x0) {
    operator_delete__(this->entries);
  }
  this->entries = local_60;
  this->allocated = (uchar)local_58;
  return;
}

Assistant:

void addStorage()
    {
        Q_ASSERT(allocated < SpanConstants::NEntries);
        Q_ASSERT(nextFree == allocated);
        // the hash table should always be between 25 and 50% full
        // this implies that we on average have between 32 and 64 entries
        // in here. More exactly, we have a binominal distribution of the amount of
        // occupied entries.
        // For a 25% filled table, the average is 32 entries, with a 95% chance that we have between
        // 23 and 41 entries.
        // For a 50% filled table, the average is 64 entries, with a 95% chance that we have between
        // 53 and 75 entries.
        // Since we only resize the table once it's 50% filled and we want to avoid copies of
        // data where possible, we initially allocate 48 entries, then resize to 80 entries, after that
        // resize by increments of 16. That way, we usually only get one resize of the table
        // while filling it.
        size_t alloc;
        static_assert(SpanConstants::NEntries % 8 == 0);
        if (!allocated)
            alloc = SpanConstants::NEntries / 8 * 3;
        else if (allocated == SpanConstants::NEntries / 8 * 3)
            alloc = SpanConstants::NEntries / 8 * 5;
        else
            alloc = allocated + SpanConstants::NEntries/8;
        Entry *newEntries = new Entry[alloc];
        // we only add storage if the previous storage was fully filled, so
        // simply copy the old data over
        if constexpr (isRelocatable<Node>()) {
            if (allocated)
                memcpy(newEntries, entries, allocated * sizeof(Entry));
        } else {
            for (size_t i = 0; i < allocated; ++i) {
                new (&newEntries[i].node()) Node(std::move(entries[i].node()));
                entries[i].node().~Node();
            }
        }
        for (size_t i = allocated; i < alloc; ++i) {
            newEntries[i].nextFree() = uchar(i + 1);
        }
        delete[] entries;
        entries = newEntries;
        allocated = uchar(alloc);
    }